

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O2

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
           *this,char *str,size_t len)

{
  node_type *node;
  xml_node<char> *data;
  ostream *poVar1;
  long in_RCX;
  vector<char,_std::allocator<char>_> buf;
  xml_document<char> doc;
  
  std::vector<char,std::allocator<char>>::vector<char_const*,void>
            ((vector<char,std::allocator<char>> *)&buf,(char *)len,(char *)(len + 1 + in_RCX),
             (allocator_type *)&doc);
  doc.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  doc.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  doc.super_xml_node<char>.m_type = node_document;
  doc.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  doc.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  doc.super_memory_pool<char>.m_end = (char *)&doc.super_memory_pool<char>.m_alloc_func;
  doc.super_memory_pool<char>.m_begin = doc.super_memory_pool<char>.m_static_memory;
  doc.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  doc.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  doc.super_memory_pool<char>.m_ptr = doc.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>
            (&doc,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  data = rapidxml::xml_node<char>::first_node(&doc.super_xml_node<char>,"bhvr_tree",0,true);
  if (data == (xml_node<char> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"bhvr_tree_error: cannot find root node");
    std::endl<char,std::char_traits<char>>(poVar1);
    (this->super_template_extend<true_node,_false_node>).super_generator_interface<_86869e04_>.
    super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
    ._vptr_generator_unit = (_func_int **)0x0;
  }
  else {
    generate_node_by_data(this,(xml_node<char> *)str);
    node = (node_type *)
           (this->super_template_extend<true_node,_false_node>).
           super_generator_interface<_86869e04_>.
           super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
           ._vptr_generator_unit;
    if (node != (node_type *)0x0) {
      generate_children((xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                         *)str,data,node);
    }
  }
  rapidxml::memory_pool<char>::~memory_pool(&doc.super_memory_pool<char>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate(const char* str, size_t len) const {
    try {
      std::vector<char> buf(str, str + len + 1);
      rapidxml::xml_document<> doc;
      doc.parse<0>(buf.data());

      auto data = doc.first_node("bhvr_tree");
      if (!data) {
        std::cerr << "bhvr_tree_error: cannot find root node" << std::endl;
        return node_pointer();
      }

      auto node = generate_node_by_data(data);
      if (node) {
        generate_children(data, *node);
      }

      return node;
    } catch (const rapidxml::parse_error& e) {
      std::cerr << "parse_error: " << e.what() << " [" << e.where<const char>() << "]" << std::endl;
    }

    return node_pointer();
  }